

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O0

void __thiscall Clasp::CBConsequences::QueryFinder::initUpper(QueryFinder *this,Solver *s)

{
  bool bVar1;
  uint32 uVar2;
  iterator pLVar3;
  Solver *in_RSI;
  iterator in_RDI;
  iterator end;
  iterator it;
  iterator j;
  undefined8 in_stack_ffffffffffffffa8;
  Solver *in_stack_ffffffffffffffb0;
  Solver *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  uint32 in_stack_ffffffffffffffcc;
  uint32 in_stack_ffffffffffffffd0;
  Literal in_stack_ffffffffffffffd4;
  Literal *local_20;
  iterator local_18;
  
  local_20 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                        (in_RDI + 0x10));
  pLVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                     ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0x10)
                     );
  local_18 = local_20;
  for (; local_20 != pLVar3; local_20 = local_20 + 1) {
    in_stack_ffffffffffffffd4.rep_ = local_20->rep_;
    bVar1 = Solver::isTrue(in_stack_ffffffffffffffb8,(Literal)(uint32)((ulong)in_RDI >> 0x20));
    if (bVar1) {
      in_stack_ffffffffffffffb8 = in_RSI;
      Literal::var(local_20);
      uVar2 = Solver::level(in_stack_ffffffffffffffb0,
                            (Var)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      if (uVar2 == 0) {
        in_stack_ffffffffffffffcc = local_20->rep_;
        State::fix((State *)in_stack_ffffffffffffffb8,(Literal)(uint32)((ulong)in_RDI >> 0x20));
      }
      else {
        local_18->rep_ = local_20->rep_;
        in_stack_ffffffffffffffd0 = local_18->rep_;
        State::push((State *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    in_stack_ffffffffffffffd4);
        local_18 = local_18 + 1;
      }
    }
  }
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0x10));
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::erase
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
             CONCAT44(in_stack_ffffffffffffffd4.rep_,in_stack_ffffffffffffffd0),
             (iterator)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI);
  return;
}

Assistant:

void CBConsequences::QueryFinder::initUpper(Solver& s) {
	LitVec::iterator j = open_.begin();
	for (LitVec::iterator it = j, end = open_.end(); it != end; ++it) {
		if (s.isTrue(*it)) {
			if (s.level(it->var())) { state_->push(*j++ = *it); }
			else                    { state_->fix(*it); }
		}
	}
	open_.erase(j, open_.end());
}